

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_vdpau_interop(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_vdpau_interop != 0) {
    glad_glVDPAUInitNV = (PFNGLVDPAUINITNVPROC)(*load)("glVDPAUInitNV");
    glad_glVDPAUFiniNV = (PFNGLVDPAUFININVPROC)(*load)("glVDPAUFiniNV");
    glad_glVDPAURegisterVideoSurfaceNV =
         (PFNGLVDPAUREGISTERVIDEOSURFACENVPROC)(*load)("glVDPAURegisterVideoSurfaceNV");
    glad_glVDPAURegisterOutputSurfaceNV =
         (PFNGLVDPAUREGISTEROUTPUTSURFACENVPROC)(*load)("glVDPAURegisterOutputSurfaceNV");
    glad_glVDPAUIsSurfaceNV = (PFNGLVDPAUISSURFACENVPROC)(*load)("glVDPAUIsSurfaceNV");
    glad_glVDPAUUnregisterSurfaceNV =
         (PFNGLVDPAUUNREGISTERSURFACENVPROC)(*load)("glVDPAUUnregisterSurfaceNV");
    glad_glVDPAUGetSurfaceivNV = (PFNGLVDPAUGETSURFACEIVNVPROC)(*load)("glVDPAUGetSurfaceivNV");
    glad_glVDPAUSurfaceAccessNV = (PFNGLVDPAUSURFACEACCESSNVPROC)(*load)("glVDPAUSurfaceAccessNV");
    glad_glVDPAUMapSurfacesNV = (PFNGLVDPAUMAPSURFACESNVPROC)(*load)("glVDPAUMapSurfacesNV");
    glad_glVDPAUUnmapSurfacesNV = (PFNGLVDPAUUNMAPSURFACESNVPROC)(*load)("glVDPAUUnmapSurfacesNV");
  }
  return;
}

Assistant:

static void load_GL_NV_vdpau_interop(GLADloadproc load) {
	if(!GLAD_GL_NV_vdpau_interop) return;
	glad_glVDPAUInitNV = (PFNGLVDPAUINITNVPROC)load("glVDPAUInitNV");
	glad_glVDPAUFiniNV = (PFNGLVDPAUFININVPROC)load("glVDPAUFiniNV");
	glad_glVDPAURegisterVideoSurfaceNV = (PFNGLVDPAUREGISTERVIDEOSURFACENVPROC)load("glVDPAURegisterVideoSurfaceNV");
	glad_glVDPAURegisterOutputSurfaceNV = (PFNGLVDPAUREGISTEROUTPUTSURFACENVPROC)load("glVDPAURegisterOutputSurfaceNV");
	glad_glVDPAUIsSurfaceNV = (PFNGLVDPAUISSURFACENVPROC)load("glVDPAUIsSurfaceNV");
	glad_glVDPAUUnregisterSurfaceNV = (PFNGLVDPAUUNREGISTERSURFACENVPROC)load("glVDPAUUnregisterSurfaceNV");
	glad_glVDPAUGetSurfaceivNV = (PFNGLVDPAUGETSURFACEIVNVPROC)load("glVDPAUGetSurfaceivNV");
	glad_glVDPAUSurfaceAccessNV = (PFNGLVDPAUSURFACEACCESSNVPROC)load("glVDPAUSurfaceAccessNV");
	glad_glVDPAUMapSurfacesNV = (PFNGLVDPAUMAPSURFACESNVPROC)load("glVDPAUMapSurfacesNV");
	glad_glVDPAUUnmapSurfacesNV = (PFNGLVDPAUUNMAPSURFACESNVPROC)load("glVDPAUUnmapSurfacesNV");
}